

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_consume_connection(nghttp2_session *session,size_t size)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -0x207;
  if ((session->opt_flags & 1) != 0) {
    iVar1 = session_update_connection_consumed_size(session,size);
    iVar2 = 0;
    if (iVar1 < -900) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_session_consume_connection(nghttp2_session *session, size_t size) {
  int rv;

  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE)) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  rv = session_update_connection_consumed_size(session, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}